

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

void __thiscall QUrl::setFragment(QUrl *this,QString *fragment,ParsingMode mode)

{
  uchar *puVar1;
  QUrlPrivate *pQVar2;
  Error *__ptr;
  QArrayData *data;
  bool bVar3;
  
  detach(this);
  pQVar2 = this->d;
  __ptr = (pQVar2->error)._M_t.
          super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
          super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
          super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  (pQVar2->error)._M_t.
  super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
  super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
  super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = (Error *)0x0;
  if (__ptr != (Error *)0x0) {
    std::default_delete<QUrlPrivate::Error>::operator()
              ((default_delete<QUrlPrivate::Error> *)&pQVar2->error,__ptr);
  }
  pQVar2 = this->d;
  puVar1 = &pQVar2->sectionIsPresent;
  *puVar1 = *puVar1 | 0x80;
  recodeFromUser(&pQVar2->fragment,fragment,userNameInIsolation + 7,mode);
  if ((fragment->d).ptr == (char16_t *)0x0) {
    puVar1 = &this->d->sectionIsPresent;
    *puVar1 = *puVar1 & 0x7f;
  }
  else if (mode == StrictMode) {
    bVar3 = QUrlPrivate::validateComponent(this->d,Fragment,fragment,0,(fragment->d).size);
    if ((!bVar3) && (pQVar2 = this->d, (pQVar2->fragment).d.ptr != (char16_t *)0x0)) {
      data = &((pQVar2->fragment).d.d)->super_QArrayData;
      (pQVar2->fragment).d.d = (Data *)0x0;
      (pQVar2->fragment).d.ptr = (char16_t *)0x0;
      (pQVar2->fragment).d.size = 0;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void QUrl::setFragment(const QString &fragment, ParsingMode mode)
{
    detach();
    d->clearError();

    d->setFragment(fragment, mode);
    if (fragment.isNull())
        d->sectionIsPresent &= ~QUrlPrivate::Fragment;
    else if (mode == StrictMode && !d->validateComponent(QUrlPrivate::Fragment, fragment))
        d->fragment.clear();
}